

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCreateTestSourceList.cxx
# Opt level: O1

bool __thiscall
cmCreateTestSourceList::InitialPass
          (cmCreateTestSourceList *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  cmMakefile *pcVar3;
  size_type sVar4;
  long *infile;
  int iVar5;
  char *pcVar6;
  undefined8 *puVar7;
  cmSourceFile *pcVar8;
  ulong *puVar9;
  undefined1 uVar10;
  string *psVar11;
  undefined8 uVar12;
  _Alloc_hider _Var13;
  pointer pbVar14;
  string *sourceName;
  pointer pbVar15;
  string sourceListValue;
  string driver;
  string functionMapCode;
  string forwardDeclareCode;
  string extraInclude;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tests;
  string function;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tests_func_name;
  string configFile;
  string local_1e8;
  cmCommand *local_1c8;
  string local_1c0;
  string local_1a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_180;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  string local_b8;
  char *local_98;
  long local_90;
  char local_88;
  undefined7 uStack_87;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  char *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  pbVar14 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_1c8 = &this->super_cmCommand;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar14) < 0x41) {
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"called with wrong number of arguments.","");
    cmCommand::SetError(local_1c8,&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,
                      CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                               local_f8.field_2._M_local_buf[0]) + 1);
    }
    uVar10 = 0;
  }
  else {
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    local_f8._M_string_length = 0;
    local_f8.field_2._M_local_buf[0] = '\0';
    local_98 = &local_88;
    local_90 = 0;
    local_88 = '\0';
    local_d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
    local_180 = args;
    if (pbVar14 !=
        (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      do {
        iVar5 = std::__cxx11::string::compare((char *)pbVar14);
        if (iVar5 == 0) {
          pbVar15 = pbVar14 + 1;
          if (pbVar15 ==
              (local_180->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
            local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1a0,"incorrect arguments to EXTRA_INCLUDE","");
            cmCommand::SetError(local_1c8,&local_1a0);
LAB_0027fe7b:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a0._M_dataplus._M_p == &local_1a0.field_2) goto LAB_0027f229;
            goto LAB_0027f21c;
          }
          std::__cxx11::string::_M_replace
                    ((ulong)&local_f8,0,(char *)local_f8._M_string_length,0x4c8b1b);
          std::__cxx11::string::_M_append((char *)&local_f8,(ulong)pbVar14[1]._M_dataplus._M_p);
          std::__cxx11::string::append((char *)&local_f8);
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)pbVar14);
          if (iVar5 == 0) {
            pbVar15 = pbVar14 + 1;
            if (pbVar15 ==
                (local_180->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
              local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1a0,"incorrect arguments to FUNCTION","");
              cmCommand::SetError(local_1c8,&local_1a0);
              goto LAB_0027fe7b;
            }
            std::__cxx11::string::_M_assign((string *)&local_98);
            std::__cxx11::string::append((char *)&local_98);
          }
          else {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&local_d8,pbVar14);
            pbVar15 = pbVar14;
          }
        }
        pbVar14 = pbVar15 + 1;
      } while (pbVar14 !=
               (local_180->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish);
    }
    pbVar14 = local_d8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pcVar2 = ((local_d8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    cmsys::SystemTools::GetFilenameExtension
              (&local_1a0,
               local_d8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1);
    paVar1 = &local_1a0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    if (local_1a0._M_string_length < 2) {
      local_1a0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1a0,"You must specify a file extension for the test driver file.",
                 "");
      cmCommand::SetError(local_1c8,&local_1a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != paVar1) {
LAB_0027f21c:
        operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
      }
LAB_0027f229:
      uVar10 = 0;
    }
    else {
      pcVar6 = cmMakefile::GetCurrentBinaryDirectory(local_1c8->Makefile);
      std::__cxx11::string::string((string *)&local_1a0,pcVar6,(allocator *)local_50);
      std::__cxx11::string::append((char *)&local_1a0);
      std::__cxx11::string::_M_append((char *)&local_1a0,(ulong)pbVar14[1]._M_dataplus._M_p);
      pcVar3 = local_1c8->Makefile;
      paVar1 = &local_118.field_2;
      local_118._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"CMAKE_ROOT","");
      pcVar6 = cmMakefile::GetRequiredDefinition(pcVar3,&local_118);
      std::__cxx11::string::string((string *)local_50,pcVar6,(allocator *)&local_158);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != paVar1) {
        operator_delete(local_118._M_dataplus._M_p,
                        CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                                 local_118.field_2._M_local_buf[0]) + 1);
      }
      local_58 = pcVar2;
      std::__cxx11::string::append((char *)local_50);
      sourceName = pbVar14 + 2;
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_118._M_string_length = 0;
      local_118.field_2._M_local_buf[0] = '\0';
      local_118._M_dataplus._M_p = (pointer)paVar1;
      if (sourceName !=
          local_d8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        psVar11 = sourceName;
        do {
          iVar5 = std::__cxx11::string::compare((char *)psVar11);
          if (iVar5 == 0) break;
          local_158._M_string_length = 0;
          local_158.field_2._M_local_buf[0] = '\0';
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          cmsys::SystemTools::GetFilenamePath(&local_1e8,psVar11);
          sVar4 = local_1e8._M_string_length;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
            operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
          }
          if (sVar4 == 0) {
            cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_1e8,psVar11);
            std::__cxx11::string::operator=((string *)&local_158,(string *)&local_1e8);
            uVar12 = local_1e8.field_2._M_allocated_capacity;
            _Var13._M_p = local_1e8._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) goto LAB_0027f5bf;
          }
          else {
            cmsys::SystemTools::GetFilenamePath(&local_178,psVar11);
            puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_178);
            local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
            puVar9 = puVar7 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar9) {
              local_1c0.field_2._M_allocated_capacity = *puVar9;
              local_1c0.field_2._8_8_ = puVar7[3];
            }
            else {
              local_1c0.field_2._M_allocated_capacity = *puVar9;
              local_1c0._M_dataplus._M_p = (pointer)*puVar7;
            }
            local_1c0._M_string_length = puVar7[1];
            *puVar7 = puVar9;
            puVar7[1] = 0;
            *(undefined1 *)(puVar7 + 2) = 0;
            cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_138,psVar11);
            uVar12 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
              uVar12 = local_1c0.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar12 < local_138._M_string_length + local_1c0._M_string_length) {
              uVar12 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_138._M_dataplus._M_p != &local_138.field_2) {
                uVar12 = local_138.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar12 < local_138._M_string_length + local_1c0._M_string_length)
              goto LAB_0027f4cb;
              puVar7 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_138,0,(char *)0x0,(ulong)local_1c0._M_dataplus._M_p)
              ;
            }
            else {
LAB_0027f4cb:
              puVar7 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_1c0,(ulong)local_138._M_dataplus._M_p);
            }
            local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
            puVar9 = puVar7 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar9) {
              local_1e8.field_2._M_allocated_capacity = *puVar9;
              local_1e8.field_2._8_8_ = puVar7[3];
            }
            else {
              local_1e8.field_2._M_allocated_capacity = *puVar9;
              local_1e8._M_dataplus._M_p = (pointer)*puVar7;
            }
            local_1e8._M_string_length = puVar7[1];
            *puVar7 = puVar9;
            puVar7[1] = 0;
            *(undefined1 *)puVar9 = 0;
            std::__cxx11::string::operator=((string *)&local_158,(string *)&local_1e8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
              operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != &local_138.field_2) {
              operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
              operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1
                             );
            }
            uVar12 = local_178.field_2._M_allocated_capacity;
            _Var13._M_p = local_178._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178._M_dataplus._M_p != &local_178.field_2) {
LAB_0027f5bf:
              operator_delete(_Var13._M_p,uVar12 + 1);
            }
          }
          cmsys::SystemTools::ConvertToUnixSlashes(&local_158);
          cmsys::SystemTools::ReplaceString(&local_158," ","_");
          cmsys::SystemTools::ReplaceString(&local_158,"/","_");
          cmsys::SystemTools::ReplaceString(&local_158,":","_");
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_78,&local_158);
          std::__cxx11::string::append((char *)&local_118);
          std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_158._M_dataplus._M_p);
          std::__cxx11::string::append((char *)&local_118);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,
                            CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                                     local_158.field_2._M_local_buf[0]) + 1);
          }
          psVar11 = psVar11 + 1;
        } while (psVar11 !=
                 local_d8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      local_158._M_string_length = 0;
      local_158.field_2._M_local_buf[0] = '\0';
      if (sourceName !=
          local_d8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        psVar11 = sourceName;
        pbVar14 = local_78.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
          local_1e8._M_string_length = 0;
          local_1e8.field_2._M_allocated_capacity =
               local_1e8.field_2._M_allocated_capacity & 0xffffffffffffff00;
          cmsys::SystemTools::GetFilenamePath(&local_1c0,psVar11);
          sVar4 = local_1c0._M_string_length;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
            operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
          }
          if (sVar4 == 0) {
            cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_1c0,psVar11);
            std::__cxx11::string::operator=((string *)&local_1e8,(string *)&local_1c0);
            uVar12 = local_1c0.field_2._M_allocated_capacity;
            _Var13._M_p = local_1c0._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) goto LAB_0027f937;
          }
          else {
            cmsys::SystemTools::GetFilenamePath(&local_138,psVar11);
            puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_138);
            local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
            puVar9 = puVar7 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar9) {
              local_178.field_2._M_allocated_capacity = *puVar9;
              local_178.field_2._8_8_ = puVar7[3];
            }
            else {
              local_178.field_2._M_allocated_capacity = *puVar9;
              local_178._M_dataplus._M_p = (pointer)*puVar7;
            }
            local_178._M_string_length = puVar7[1];
            *puVar7 = puVar9;
            puVar7[1] = 0;
            *(undefined1 *)(puVar7 + 2) = 0;
            cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_b8,psVar11);
            uVar12 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178._M_dataplus._M_p != &local_178.field_2) {
              uVar12 = local_178.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar12 < local_b8._M_string_length + local_178._M_string_length) {
              uVar12 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                uVar12 = local_b8.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar12 < local_b8._M_string_length + local_178._M_string_length)
              goto LAB_0027f837;
              puVar7 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_b8,0,(char *)0x0,(ulong)local_178._M_dataplus._M_p);
            }
            else {
LAB_0027f837:
              puVar7 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_178,(ulong)local_b8._M_dataplus._M_p);
            }
            local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
            puVar9 = puVar7 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar9) {
              local_1c0.field_2._M_allocated_capacity = *puVar9;
              local_1c0.field_2._8_8_ = puVar7[3];
            }
            else {
              local_1c0.field_2._M_allocated_capacity = *puVar9;
              local_1c0._M_dataplus._M_p = (pointer)*puVar7;
            }
            local_1c0._M_string_length = puVar7[1];
            *puVar7 = puVar9;
            puVar7[1] = 0;
            *(undefined1 *)puVar9 = 0;
            std::__cxx11::string::operator=((string *)&local_1e8,(string *)&local_1c0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
              operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178._M_dataplus._M_p != &local_178.field_2) {
              operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1
                             );
            }
            uVar12 = local_138.field_2._M_allocated_capacity;
            _Var13._M_p = local_138._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != &local_138.field_2) {
LAB_0027f937:
              operator_delete(_Var13._M_p,uVar12 + 1);
            }
          }
          std::__cxx11::string::append((char *)&local_158);
          std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_1e8._M_dataplus._M_p);
          std::__cxx11::string::append((char *)&local_158);
          std::__cxx11::string::_M_append((char *)&local_158,(ulong)(pbVar14->_M_dataplus)._M_p);
          std::__cxx11::string::append((char *)&local_158);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
            operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
          }
          psVar11 = psVar11 + 1;
          pbVar14 = pbVar14 + 1;
        } while (psVar11 !=
                 local_d8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      if ((char *)local_f8._M_string_length != (char *)0x0) {
        pcVar3 = local_1c8->Makefile;
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1e8,"CMAKE_TESTDRIVER_EXTRA_INCLUDES","");
        cmMakefile::AddDefinition(pcVar3,&local_1e8,local_f8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
      }
      if (local_90 != 0) {
        pcVar3 = local_1c8->Makefile;
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1e8,"CMAKE_TESTDRIVER_ARGVC_FUNCTION","");
        cmMakefile::AddDefinition(pcVar3,&local_1e8,local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
      }
      pcVar3 = local_1c8->Makefile;
      paVar1 = &local_1e8.field_2;
      local_1e8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1e8,"CMAKE_FORWARD_DECLARE_TESTS","");
      cmMakefile::AddDefinition(pcVar3,&local_1e8,local_118._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      pcVar3 = local_1c8->Makefile;
      local_1e8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1e8,"CMAKE_FUNCTION_TABLE_ENTIRES","");
      cmMakefile::AddDefinition(pcVar3,&local_1e8,local_158._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      infile = local_50[0];
      _Var13._M_p = local_1a0._M_dataplus._M_p;
      pcVar3 = local_1c8->Makefile;
      cmNewLineStyle::cmNewLineStyle((cmNewLineStyle *)&local_1e8);
      iVar5 = cmMakefile::ConfigureFile
                        (pcVar3,(char *)infile,_Var13._M_p,false,true,false,
                         (cmNewLineStyle *)&local_1e8);
      local_1e8._M_string_length = 0;
      local_1e8.field_2._M_allocated_capacity =
           local_1e8.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_1e8._M_dataplus._M_p = (pointer)paVar1;
      pcVar8 = cmMakefile::GetOrCreateSource(local_1c8->Makefile,&local_1a0,false);
      paVar1 = &local_1c0.field_2;
      local_1c0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"ABSTRACT","");
      cmSourceFile::SetProperty(pcVar8,&local_1c0,"0");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::_M_assign((string *)&local_1e8);
      local_180 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)CONCAT44(local_180._4_4_,(int)CONCAT71((int7)((ulong)infile >> 8),iVar5 != 0));
      if (sourceName !=
          local_d8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          pcVar8 = cmMakefile::GetOrCreateSource(local_1c8->Makefile,sourceName,false);
          local_1c0._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"ABSTRACT","");
          cmSourceFile::SetProperty(pcVar8,&local_1c0,"0");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c0._M_dataplus._M_p != paVar1) {
            operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)&local_1e8);
          std::__cxx11::string::_M_append((char *)&local_1e8,(ulong)(sourceName->_M_dataplus)._M_p);
          sourceName = sourceName + 1;
        } while (sourceName !=
                 local_d8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      pcVar3 = local_1c8->Makefile;
      std::__cxx11::string::string((string *)&local_1c0,local_58,(allocator *)&local_178);
      cmMakefile::AddDefinition(pcVar3,&local_1c0,local_1e8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
      }
      uVar10 = local_180._0_1_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,
                        CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                                 local_158.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,
                        CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                                 local_118.field_2._M_local_buf[0]) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_78);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
        operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_d8);
    if (local_98 != &local_88) {
      operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,
                      CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                               local_f8.field_2._M_local_buf[0]) + 1);
    }
  }
  return (bool)uVar10;
}

Assistant:

bool cmCreateTestSourceList
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if (args.size() < 3)
    {
    this->SetError("called with wrong number of arguments.");
    return false;
    }


  std::vector<std::string>::const_iterator i = args.begin();
  std::string extraInclude;
  std::string function;
  std::vector<std::string> tests;
  // extract extra include and function ot
  for(; i != args.end(); i++)
    {
    if(*i == "EXTRA_INCLUDE")
      {
      ++i;
      if(i == args.end())
        {
        this->SetError("incorrect arguments to EXTRA_INCLUDE");
        return false;
        }
      extraInclude = "#include \"";
      extraInclude += *i;
      extraInclude += "\"\n";
      }
    else if(*i == "FUNCTION")
      {
      ++i;
      if(i == args.end())
        {
        this->SetError("incorrect arguments to FUNCTION");
        return false;
        }
      function = *i;
      function += "(&ac, &av);\n";
      }
    else
      {
      tests.push_back(*i);
      }
    }
  i = tests.begin();

  // Name of the source list

  const char* sourceList = i->c_str();
  ++i;

  // Name of the test driver
  // make sure they specified an extension
  if (cmSystemTools::GetFilenameExtension(*i).size() < 2)
    {
    this->SetError(
      "You must specify a file extension for the test driver file.");
    return false;
    }
  std::string driver = this->Makefile->GetCurrentBinaryDirectory();
  driver += "/";
  driver += *i;
  ++i;

  std::string configFile =
    this->Makefile->GetRequiredDefinition("CMAKE_ROOT");

  configFile += "/Templates/TestDriver.cxx.in";
  // Create the test driver file

  std::vector<std::string>::const_iterator testsBegin = i;
  std::vector<std::string> tests_func_name;

  // The rest of the arguments consist of a list of test source files.
  // Sadly, they can be in directories. Let's find a unique function
  // name for the corresponding test, and push it to the tests_func_name
  // list.
  // For the moment:
  //   - replace spaces ' ', ':' and '/' with underscores '_'
  std::string forwardDeclareCode;
  for(i = testsBegin; i != tests.end(); ++i)
    {
    if(*i == "EXTRA_INCLUDE")
      {
      break;
      }
    std::string func_name;
    if (!cmSystemTools::GetFilenamePath(*i).empty())
      {
      func_name = cmSystemTools::GetFilenamePath(*i) + "/" +
        cmSystemTools::GetFilenameWithoutLastExtension(*i);
      }
    else
      {
      func_name = cmSystemTools::GetFilenameWithoutLastExtension(*i);
      }
    cmSystemTools::ConvertToUnixSlashes(func_name);
    cmSystemTools::ReplaceString(func_name, " ", "_");
    cmSystemTools::ReplaceString(func_name, "/", "_");
    cmSystemTools::ReplaceString(func_name, ":", "_");
    tests_func_name.push_back(func_name);
    forwardDeclareCode += "int ";
    forwardDeclareCode += func_name;
    forwardDeclareCode += "(int, char*[]);\n";
    }

  std::string functionMapCode;
  int numTests = 0;
  std::vector<std::string>::iterator j;
  for(i = testsBegin, j = tests_func_name.begin(); i != tests.end(); ++i, ++j)
    {
    std::string func_name;
    if (!cmSystemTools::GetFilenamePath(*i).empty())
      {
      func_name = cmSystemTools::GetFilenamePath(*i) + "/" +
        cmSystemTools::GetFilenameWithoutLastExtension(*i);
      }
    else
      {
      func_name = cmSystemTools::GetFilenameWithoutLastExtension(*i);
      }
    functionMapCode += "  {\n"
      "    \"";
    functionMapCode += func_name;
    functionMapCode += "\",\n"
      "    ";
    functionMapCode +=  *j;
    functionMapCode += "\n"
      "  },\n";
    numTests++;
    }
  if(!extraInclude.empty())
    {
    this->Makefile->AddDefinition("CMAKE_TESTDRIVER_EXTRA_INCLUDES",
                                  extraInclude.c_str());
    }
  if(!function.empty())
    {
    this->Makefile->AddDefinition("CMAKE_TESTDRIVER_ARGVC_FUNCTION",
                                  function.c_str());
    }
  this->Makefile->AddDefinition("CMAKE_FORWARD_DECLARE_TESTS",
    forwardDeclareCode.c_str());
  this->Makefile->AddDefinition("CMAKE_FUNCTION_TABLE_ENTIRES",
    functionMapCode.c_str());
  bool res = true;
  if ( !this->Makefile->ConfigureFile(configFile.c_str(), driver.c_str(),
      false, true, false) )
    {
    res = false;
    }

  // Construct the source list.
  std::string sourceListValue;
  {
  cmSourceFile* sf = this->Makefile->GetOrCreateSource(driver);
  sf->SetProperty("ABSTRACT","0");
  sourceListValue = args[1];
  }
  for(i = testsBegin; i != tests.end(); ++i)
    {
    cmSourceFile* sf = this->Makefile->GetOrCreateSource(*i);
    sf->SetProperty("ABSTRACT","0");
    sourceListValue += ";";
    sourceListValue += *i;
    }

  this->Makefile->AddDefinition(sourceList, sourceListValue.c_str());
  return res;
}